

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv_clock_gettime(uv_clock_id clock_id,uv_timespec64_t *ts)

{
  int *piVar1;
  int local_2c;
  undefined1 auStack_28 [4];
  int r;
  timespec t;
  uv_timespec64_t *ts_local;
  uv_clock_id clock_id_local;
  
  if (ts == (uv_timespec64_t *)0x0) {
    ts_local._4_4_ = -0xe;
  }
  else {
    t.tv_nsec = (__syscall_slong_t)ts;
    if (clock_id == UV_CLOCK_MONOTONIC) {
      local_2c = clock_gettime(1,(timespec *)auStack_28);
    }
    else {
      if (clock_id != UV_CLOCK_REALTIME) {
        return -0x16;
      }
      local_2c = clock_gettime(0,(timespec *)auStack_28);
    }
    if (local_2c == 0) {
      *(__time_t *)t.tv_nsec = _auStack_28;
      *(undefined4 *)(t.tv_nsec + 8) = (undefined4)t.tv_sec;
      ts_local._4_4_ = 0;
    }
    else {
      piVar1 = __errno_location();
      ts_local._4_4_ = -*piVar1;
    }
  }
  return ts_local._4_4_;
}

Assistant:

int uv_clock_gettime(uv_clock_id clock_id, uv_timespec64_t* ts) {
  struct timespec t;
  int r;

  if (ts == NULL)
    return UV_EFAULT;

  switch (clock_id) {
    default:
      return UV_EINVAL;
    case UV_CLOCK_MONOTONIC:
      r = clock_gettime(CLOCK_MONOTONIC, &t);
      break;
    case UV_CLOCK_REALTIME:
      r = clock_gettime(CLOCK_REALTIME, &t);
      break;
  }

  if (r)
    return UV__ERR(errno);

  ts->tv_sec = t.tv_sec;
  ts->tv_nsec = t.tv_nsec;

  return 0;
}